

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_posix::time_put_posix<char>::do_put
          (time_put_posix<char> *this,iter_type out,ios_base *param_3,char param_4,tm *tm,
          char format,char modifier)

{
  ulong uVar1;
  ostreambuf_iterator<char,_std::char_traits<char>_> *this_00;
  ostreambuf_iterator<char,_std::char_traits<char>_> *this_01;
  undefined1 in_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  iter_type iVar2;
  uint i;
  string_type res;
  char_type fmt [4];
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 *local_b8;
  uint local_74;
  string local_70 [8];
  locale_t in_stack_ffffffffffffff98;
  tm *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined1 local_49 [33];
  ostreambuf_iterator<char,_std::char_traits<char>_> local_28;
  streambuf_type *local_18;
  undefined1 uStack_10;
  
  local_b8 = local_49;
  local_28._M_sbuf = in_RSI;
  local_28._M_failed = (bool)in_DL;
  do {
    *local_b8 = 0;
    local_b8 = local_b8 + 1;
  } while (local_b8 != local_49 + 1);
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  ftime_traits<char>::ftime_abi_cxx11_
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_74 = 0; uVar1 = std::__cxx11::string::size(), local_74 < uVar1; local_74 = local_74 + 1
      ) {
    this_00 = (ostreambuf_iterator<char,_std::char_traits<char>_> *)
              std::__cxx11::string::operator[]((ulong)local_70);
    this_01 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_28,0);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(this_01);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
              (this_00,(char)((ulong)this_01 >> 0x38));
  }
  uStack_10 = local_28._M_failed;
  local_18 = local_28._M_sbuf;
  std::__cxx11::string::~string(local_70);
  iVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar2._M_failed = (bool)uStack_10;
  iVar2._M_sbuf = local_18;
  return iVar2;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType /*fill*/,std::tm const *tm,char format,char modifier) const
    {
        char_type fmt[4] = { '%' , modifier != 0 ? modifier : format , modifier == 0 ? '\0' : format };
        string_type res = ftime_traits<char_type>::ftime(fmt,tm,*lc_);
        for(unsigned i=0;i<res.size();i++)
            *out++ = res[i];
        return out;
    }